

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fTextureMipmapTests.cpp
# Opt level: O2

int __thiscall
deqp::gles3::Functional::Texture2DLodControlCase::init
          (Texture2DLodControlCase *this,EVP_PKEY_CTX *ctx)

{
  pointer pPVar1;
  uint uVar2;
  uint uVar3;
  Texture2D *this_00;
  ulong uVar4;
  ulong extraout_RAX;
  uint uVar5;
  long lVar6;
  uint uVar7;
  ulong uVar8;
  RGBA local_44;
  Vec4 local_40;
  
  uVar5 = this->m_texWidth;
  uVar3 = this->m_texHeight;
  uVar2 = uVar3;
  if ((int)uVar3 < (int)uVar5) {
    uVar2 = uVar5;
  }
  if (uVar2 == 0) {
    uVar7 = 0x20;
  }
  else {
    uVar7 = 0x1f;
    if (uVar2 != 0) {
      for (; uVar2 >> uVar7 == 0; uVar7 = uVar7 - 1) {
      }
    }
    uVar7 = uVar7 ^ 0x1f;
  }
  this_00 = (Texture2D *)operator_new(0x70);
  glu::Texture2D::Texture2D
            (this_00,((this->super_TestCase).m_context)->m_renderCtx,0x8058,uVar5,uVar3);
  uVar4 = (ulong)(0x1f - uVar7);
  this->m_texture = this_00;
  lVar6 = 0;
  for (uVar8 = 0; 0x20 - uVar7 != uVar8; uVar8 = uVar8 + 1) {
    uVar3 = (int)(0xff / (long)(int)(0x1f - uVar7)) * (int)uVar8;
    uVar5 = uVar3;
    if (0xfe < uVar3) {
      uVar5 = 0xff;
    }
    uVar5 = uVar5 * 0x10100 ^ 0xff00ffff;
    if ((int)uVar3 < 0) {
      uVar5 = 0xff00ffff;
    }
    tcu::Texture2D::allocLevel(&this->m_texture->m_refTexture,(int)uVar8);
    pPVar1 = (this->m_texture->m_refTexture).super_TextureLevelPyramid.m_access.
             super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>.
             _M_impl.super__Vector_impl_data._M_start;
    local_44.m_value = uVar5;
    tcu::RGBA::toVec(&local_44);
    tcu::clear((PixelBufferAccess *)
               ((long)(pPVar1->super_ConstPixelBufferAccess).m_size.m_data + lVar6 + -8),&local_40);
    lVar6 = lVar6 + 0x28;
    uVar4 = extraout_RAX;
  }
  return (int)uVar4;
}

Assistant:

void Texture2DLodControlCase::init (void)
{
	const deUint32	format		= GL_RGBA8;
	int				numLevels	= deLog2Floor32(de::max(m_texWidth, m_texHeight))+1;

	m_texture = new glu::Texture2D(m_context.getRenderContext(), format, m_texWidth, m_texHeight);

	// Fill texture with colored grid.
	for (int levelNdx = 0; levelNdx < numLevels; levelNdx++)
	{
		deUint32	step		= 0xff / (numLevels-1);
		deUint32	inc			= deClamp32(step*levelNdx, 0x00, 0xff);
		deUint32	dec			= 0xff - inc;
		deUint32	rgb			= (inc << 16) | (dec << 8) | 0xff;
		deUint32	color		= 0xff000000 | rgb;

		m_texture->getRefTexture().allocLevel(levelNdx);
		tcu::clear(m_texture->getRefTexture().getLevel(levelNdx), tcu::RGBA(color).toVec());
	}
}